

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall aiMemoryInfo::aiMemoryInfo(aiMemoryInfo *this)

{
  aiMemoryInfo *this_local;
  
  this->textures = 0;
  this->materials = 0;
  this->meshes = 0;
  this->nodes = 0;
  this->animations = 0;
  this->cameras = 0;
  this->lights = 0;
  this->total = 0;
  return;
}

Assistant:

aiMemoryInfo() AI_NO_EXCEPT
        : textures   (0)
        , materials  (0)
        , meshes     (0)
        , nodes      (0)
        , animations (0)
        , cameras    (0)
        , lights     (0)
        , total      (0)
    {}